

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

ssize_t session_call_select_padding
                  (nghttp2_session *session,nghttp2_frame *frame,size_t max_payloadlen)

{
  size_t local_40;
  size_t max_paddedlen;
  ssize_t rv;
  size_t max_payloadlen_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->hd).length < max_payloadlen) {
    if ((session->callbacks).select_padding_callback == (nghttp2_select_padding_callback)0x0) {
      session_local = (nghttp2_session *)(frame->hd).length;
    }
    else {
      local_40 = max_payloadlen;
      if ((frame->hd).length + 0x100 < max_payloadlen) {
        local_40 = (frame->hd).length + 0x100;
      }
      session_local =
           (nghttp2_session *)
           (*(session->callbacks).select_padding_callback)
                     (session,frame,local_40,session->user_data);
      if (((long)session_local < (long)(frame->hd).length) || ((long)local_40 < (long)session_local)
         ) {
        session_local = (nghttp2_session *)0xfffffffffffffc7a;
      }
    }
  }
  else {
    session_local = (nghttp2_session *)(frame->hd).length;
  }
  return (ssize_t)session_local;
}

Assistant:

static ssize_t session_call_select_padding(nghttp2_session *session,
                                           const nghttp2_frame *frame,
                                           size_t max_payloadlen) {
  ssize_t rv;

  if (frame->hd.length >= max_payloadlen) {
    return (ssize_t)frame->hd.length;
  }

  if (session->callbacks.select_padding_callback) {
    size_t max_paddedlen;

    max_paddedlen =
        nghttp2_min(frame->hd.length + NGHTTP2_MAX_PADLEN, max_payloadlen);

    rv = session->callbacks.select_padding_callback(
        session, frame, max_paddedlen, session->user_data);
    if (rv < (ssize_t)frame->hd.length || rv > (ssize_t)max_paddedlen) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    return rv;
  }
  return (ssize_t)frame->hd.length;
}